

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

size_t Curl_bufq_len(bufq *q)

{
  size_t sVar1;
  size_t local_20;
  size_t len;
  buf_chunk *chunk;
  bufq *q_local;
  
  len = (size_t)q->head;
  local_20 = 0;
  for (; len != 0; len = *(size_t *)len) {
    sVar1 = chunk_len((buf_chunk *)len);
    local_20 = sVar1 + local_20;
  }
  return local_20;
}

Assistant:

size_t Curl_bufq_len(const struct bufq *q)
{
  const struct buf_chunk *chunk = q->head;
  size_t len = 0;
  while(chunk) {
    len += chunk_len(chunk);
    chunk = chunk->next;
  }
  return len;
}